

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

type * check_declarator(c2m_ctx_t c2m_ctx,node_t_conflict r,int func_def_p)

{
  uchar uVar1;
  node_code_t nVar2;
  check_ctx *pcVar3;
  node_t_conflict pnVar4;
  node_t pnVar5;
  long lVar6;
  byte *pbVar7;
  node_t pnVar8;
  type *el;
  arr_type *paVar9;
  node_t_conflict pnVar10;
  decl_spec *pdVar11;
  type *head;
  bool bVar12;
  pos_t pVar13;
  
  pnVar8 = (r->u).ops.head;
  if (pnVar8 != (node_t)0x0) {
    pnVar8 = (pnVar8->op_link).next;
  }
  if (r->code != N_DECL) {
    __assert_fail("r->code == N_DECL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1b49,"struct type *check_declarator(c2m_ctx_t, node_t, int)");
  }
  pnVar8 = (pnVar8->u).ops.head;
  if (pnVar8 == (node_t)0x0) {
    head = (type *)0x0;
  }
  else {
    pcVar3 = c2m_ctx->check_ctx;
    head = (type *)0x0;
    do {
      el = (type *)reg_malloc(c2m_ctx,0x38);
      *(byte *)&el->type_qual = *(byte *)&el->type_qual & 0xf0;
      el->mode = TM_UNDEF;
      el->pos_node = (node_t_conflict)0x0;
      el->arr_type = (type *)0x0;
      el->antialias = 0;
      el->align = -1;
      el->raw_size = 0xffffffffffffffff;
      el->func_type_before_adjustment_p = '\0';
      el->unnamed_anon_struct_union_member_type_p = '\0';
      el->pos_node = pnVar8;
      nVar2 = pnVar8->code;
      if (nVar2 == N_FUNC) {
        pnVar5 = (pnVar8->u).ops.head;
        pnVar4 = (pnVar5->u).ops.tail;
        uVar1 = pcVar3->in_params_p;
        el->mode = TM_FUNC;
        el->pos_node = pnVar8;
        pnVar10 = (node_t_conflict)reg_malloc(c2m_ctx,0x20);
        (el->u).tag_type = pnVar10;
        bVar12 = false;
        pnVar10->attr = (void *)0x0;
        (pnVar10->op_link).next = (node_t)0x0;
        if (pnVar4 != (node_t_conflict)0x0) {
          bVar12 = pnVar4->code == N_DOTS;
        }
        *(undefined1 *)&pnVar10->code = (char)pnVar10->code & (N_ATTR|N_MODULE) | bVar12;
        if (bVar12 != false) {
          DLIST_node_t_remove(&(pnVar5->u).ops,pnVar4);
        }
        if (func_def_p == 0) {
          create_node_scope(c2m_ctx,pnVar8);
        }
        (pnVar10->op_link).prev = pnVar5;
        pcVar3->in_params_p = '\x01';
        pnVar4 = (pnVar5->u).ops.head;
        pnVar10 = pnVar4;
        if (pnVar4 == (node_t_conflict)0x0) {
joined_r0x0018892c:
          for (; pnVar10 != (node_t_conflict)0x0; pnVar10 = (pnVar10->op_link).next) {
            nVar2 = pnVar10->code;
            if (nVar2 == N_ID) {
              if (func_def_p == 0) {
                pVar13 = get_node_pos(c2m_ctx,pnVar10);
                error(c2m_ctx,0x1c21c1,pVar13.fname,pVar13._8_8_);
              }
            }
            else {
              if (pnVar10 != pnVar4) {
                check(c2m_ctx,pnVar10,pnVar8);
              }
              pdVar11 = get_param_decl_spec(pnVar10);
              adjust_param_type(c2m_ctx,&pdVar11->type);
            }
            if (nVar2 == N_ID) break;
          }
        }
        else {
          if (pnVar4->code != N_ID) {
            check(c2m_ctx,pnVar4,pnVar8);
          }
          if ((((pnVar4 == (node_t_conflict)0x0) || (pnVar4->code != N_TYPE)) ||
              (lVar6 = *(long *)((long)pnVar4->attr + 0x18), *(int *)(lVar6 + 0x18) != 1)) ||
             (*(int *)(lVar6 + 0x30) != 1)) goto joined_r0x0018892c;
          pbVar7 = (byte *)pnVar4->attr;
          if ((*pbVar7 & 0xef) == 0) {
            bVar12 = *(long *)(pbVar7 + 8) == 0;
          }
          else {
            bVar12 = false;
          }
          if ((((*pbVar7 & 0x10) != 0) || (!bVar12)) ||
             ((*(byte *)(*(long *)(pbVar7 + 0x18) + 0x14) & 0xf) != 0)) {
            pVar13 = get_node_pos(c2m_ctx,pnVar4);
            error(c2m_ctx,0x1c2188,pVar13.fname,pVar13._8_8_);
          }
          if ((pnVar4->op_link).next != (node_t)0x0) {
            pVar13 = get_node_pos(c2m_ctx,pnVar4);
            error(c2m_ctx,0x1c21a1,pVar13.fname,pVar13._8_8_);
          }
        }
        pcVar3->in_params_p = uVar1;
        if (func_def_p == 0) {
          c2m_ctx->check_ctx->curr_scope =
               *(node_t_conflict *)((long)c2m_ctx->check_ctx->curr_scope->attr + 0x20);
        }
      }
      else if (nVar2 == N_ARR) {
        pnVar5 = (pnVar8->u).ops.head;
        pnVar4 = (pnVar5->op_link).next;
        pnVar10 = (pnVar4->op_link).next;
        el->mode = TM_ARR;
        el->pos_node = pnVar8;
        paVar9 = (arr_type *)reg_malloc(c2m_ctx,0x20);
        (el->u).arr_type = paVar9;
        *(byte *)&paVar9->ind_type_qual = *(byte *)&paVar9->ind_type_qual & 0xf0;
        set_type_qual(c2m_ctx,pnVar4,&paVar9->ind_type_qual,TM_UNDEF);
        check(c2m_ctx,pnVar10,pnVar8);
        paVar9->size = pnVar10;
        *(byte *)paVar9 = *(byte *)paVar9 & 0xfe | pnVar5->code == N_STATIC;
        paVar9->el_type = (type *)0x0;
      }
      else {
        if (nVar2 != N_POINTER) {
          abort();
        }
        pnVar4 = (pnVar8->u).ops.head;
        el->mode = TM_PTR;
        el->pos_node = pnVar8;
        (el->u).tag_type = (node_t_conflict)0x0;
        set_type_qual(c2m_ctx,pnVar4,&el->type_qual,TM_PTR);
      }
      head = append_type(head,el);
      pnVar8 = (pnVar8->op_link).next;
    } while (pnVar8 != (node_t)0x0);
  }
  return head;
}

Assistant:

static struct type *check_declarator (c2m_ctx_t c2m_ctx, node_t r, int func_def_p) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  struct type *type, *res = NULL;
  node_t list = NL_EL (r->u.ops, 1);

  assert (r->code == N_DECL);
  if (NL_HEAD (list->u.ops) == NULL) return NULL;
  for (node_t n = NL_HEAD (list->u.ops); n != NULL; n = NL_NEXT (n)) {
    type = create_type (c2m_ctx, NULL);
    type->pos_node = n;
    switch (n->code) {
    case N_POINTER: {
      node_t type_qual = NL_HEAD (n->u.ops);

      type->mode = TM_PTR;
      type->pos_node = n;
      type->u.ptr_type = NULL;
      set_type_qual (c2m_ctx, type_qual, &type->type_qual, TM_PTR);
      break;
    }
    case N_ARR: {
      struct arr_type *arr_type;
      node_t static_node = NL_HEAD (n->u.ops);
      node_t type_qual = NL_NEXT (static_node);
      node_t size = NL_NEXT (type_qual);

      type->mode = TM_ARR;
      type->pos_node = n;
      type->u.arr_type = arr_type = reg_malloc (c2m_ctx, sizeof (struct arr_type));
      clear_type_qual (&arr_type->ind_type_qual);
      set_type_qual (c2m_ctx, type_qual, &arr_type->ind_type_qual, TM_UNDEF);
      check (c2m_ctx, size, n);
      arr_type->size = size;
      arr_type->static_p = static_node->code == N_STATIC;
      arr_type->el_type = NULL;
      break;
    }
    case N_FUNC: {
      struct func_type *func_type;
      node_t first_param, param_list = NL_HEAD (n->u.ops);
      node_t last = NL_TAIL (param_list->u.ops);
      int saved_in_params_p = in_params_p;

      type->mode = TM_FUNC;
      type->pos_node = n;
      type->u.func_type = func_type = reg_malloc (c2m_ctx, sizeof (struct func_type));
      func_type->ret_type = NULL;
      func_type->proto_item = NULL;
      if ((func_type->dots_p = last != NULL && last->code == N_DOTS))
        NL_REMOVE (param_list->u.ops, last);
      if (!func_def_p) create_node_scope (c2m_ctx, n);
      func_type->param_list = param_list;
      in_params_p = TRUE;
      first_param = NL_HEAD (param_list->u.ops);
      if (first_param != NULL && first_param->code != N_ID) check (c2m_ctx, first_param, n);
      if (void_param_p (first_param)) {
        struct decl_spec *ds = first_param->attr;

        if (non_reg_decl_spec_p (ds) || ds->register_p
            || !type_qual_eq_p (&ds->type->type_qual, &zero_type_qual)) {
          error (c2m_ctx, POS (first_param), "qualified void parameter");
        }
        if (NL_NEXT (first_param) != NULL) {
          error (c2m_ctx, POS (first_param), "void must be the only parameter");
        }
      } else {
        for (node_t p = first_param; p != NULL; p = NL_NEXT (p)) {
          struct decl_spec *decl_spec_ptr;

          if (p->code == N_ID) {
            if (!func_def_p)
              error (c2m_ctx, POS (p),
                     "parameters identifier list can be only in function definition");
            break;
          } else {
            if (p != first_param) check (c2m_ctx, p, n);
            decl_spec_ptr = get_param_decl_spec (p);
            adjust_param_type (c2m_ctx, &decl_spec_ptr->type);
          }
        }
      }
      in_params_p = saved_in_params_p;
      if (!func_def_p) finish_scope (c2m_ctx);
      break;
    }
    default: abort ();
    }
    res = append_type (res, type);
  }
  return res;
}